

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O3

void __thiscall
duckdb::BlockManager::BlockManager
          (BlockManager *this,BufferManager *buffer_manager,optional_idx block_alloc_size_p,
          optional_idx block_header_size_p)

{
  _Head_base<0UL,_duckdb::MetadataManager_*,_false> this_00;
  
  this->_vptr_BlockManager = (_func_int **)&PTR__BlockManager_01974f00;
  this->buffer_manager = buffer_manager;
  (this->blocks_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->blocks_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->blocks_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->blocks_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->blocks_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->blocks)._M_h._M_buckets = &(this->blocks)._M_h._M_single_bucket;
  (this->blocks)._M_h._M_bucket_count = 1;
  (this->blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->blocks)._M_h._M_element_count = 0;
  (this->blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00._M_head_impl = (MetadataManager *)operator_new(0x80);
  MetadataManager::MetadataManager(this_00._M_head_impl,this,buffer_manager);
  (this->metadata_manager).
  super_unique_ptr<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::MetadataManager_*,_std::default_delete<duckdb::MetadataManager>_>.
  super__Head_base<0UL,_duckdb::MetadataManager_*,_false>._M_head_impl = this_00._M_head_impl;
  (this->block_alloc_size).index = block_alloc_size_p.index;
  (this->block_header_size).index = block_header_size_p.index;
  return;
}

Assistant:

BlockManager::BlockManager(BufferManager &buffer_manager, const optional_idx block_alloc_size_p,
                           const optional_idx block_header_size_p)
    : buffer_manager(buffer_manager), metadata_manager(make_uniq<MetadataManager>(*this, buffer_manager)),
      block_alloc_size(block_alloc_size_p), block_header_size(block_header_size_p) {
}